

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream.c
# Opt level: O0

void uv__drain(uv_stream_t *stream)

{
  uv_shutdown_t *puVar1;
  int iVar2;
  int *piVar3;
  int local_1c;
  int err;
  uv_shutdown_t *req;
  uv_stream_t *stream_local;
  
  if (stream->write_queue != (void **)stream->write_queue[0]) {
    __assert_fail("QUEUE_EMPTY(&stream->write_queue)",
                  "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                  ,0x29a,"void uv__drain(uv_stream_t *)");
  }
  uv__io_stop(stream->loop,&stream->io_watcher,4);
  uv__stream_osx_interrupt_select(stream);
  if ((((stream->flags & 8) != 0) && ((stream->flags & 1) == 0)) && ((stream->flags & 0x10) == 0)) {
    if (stream->shutdown_req == (uv_shutdown_t *)0x0) {
      __assert_fail("stream->shutdown_req",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x2a2,"void uv__drain(uv_stream_t *)");
    }
    puVar1 = stream->shutdown_req;
    stream->shutdown_req = (uv_shutdown_t *)0x0;
    stream->flags = stream->flags & 0xfffffff7;
    if (stream->loop->active_reqs == (void **)stream->loop->active_reqs[0]) {
      __assert_fail("uv__has_active_reqs(stream->loop)",
                    "/workspace/llm4binary/github/license_c_cmakelists/jdavidberger[P]CMake/Utilities/cmlibuv/src/unix/stream.c"
                    ,0x2a7,"void uv__drain(uv_stream_t *)");
    }
    *(void **)puVar1->active_queue[1] = puVar1->active_queue[0];
    *(void **)((long)puVar1->active_queue[0] + 8) = puVar1->active_queue[1];
    local_1c = 0;
    iVar2 = shutdown((stream->io_watcher).fd,1);
    if (iVar2 != 0) {
      piVar3 = __errno_location();
      local_1c = -*piVar3;
    }
    if (local_1c == 0) {
      stream->flags = stream->flags | 0x10;
    }
    if (puVar1->cb != (uv_shutdown_cb)0x0) {
      (*puVar1->cb)(puVar1,local_1c);
    }
  }
  return;
}

Assistant:

static void uv__drain(uv_stream_t* stream) {
  uv_shutdown_t* req;
  int err;

  assert(QUEUE_EMPTY(&stream->write_queue));
  uv__io_stop(stream->loop, &stream->io_watcher, POLLOUT);
  uv__stream_osx_interrupt_select(stream);

  /* Shutdown? */
  if ((stream->flags & UV_STREAM_SHUTTING) &&
      !(stream->flags & UV_CLOSING) &&
      !(stream->flags & UV_STREAM_SHUT)) {
    assert(stream->shutdown_req);

    req = stream->shutdown_req;
    stream->shutdown_req = NULL;
    stream->flags &= ~UV_STREAM_SHUTTING;
    uv__req_unregister(stream->loop, req);

    err = 0;
    if (shutdown(uv__stream_fd(stream), SHUT_WR))
      err = -errno;

    if (err == 0)
      stream->flags |= UV_STREAM_SHUT;

    if (req->cb != NULL)
      req->cb(req, err);
  }
}